

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O0

int32_t __thiscall
icu_63::UnicodeString::toUTF32
          (UnicodeString *this,UChar32 *utf32,int32_t capacity,UErrorCode *errorCode)

{
  int32_t destCapacity;
  UChar32 *dest;
  UBool UVar1;
  int32_t srcLength;
  char16_t *src;
  int32_t local_2c;
  UErrorCode *pUStack_28;
  int32_t length32;
  UErrorCode *errorCode_local;
  UChar32 *pUStack_18;
  int32_t capacity_local;
  UChar32 *utf32_local;
  UnicodeString *this_local;
  
  local_2c = 0;
  pUStack_28 = errorCode;
  errorCode_local._4_4_ = capacity;
  pUStack_18 = utf32;
  utf32_local = (UChar32 *)this;
  UVar1 = ::U_SUCCESS(*errorCode);
  dest = pUStack_18;
  destCapacity = errorCode_local._4_4_;
  if (UVar1 != '\0') {
    src = getBuffer(this);
    srcLength = length(this);
    u_strToUTF32WithSub_63
              (dest,destCapacity,&local_2c,src,srcLength,0xfffd,(int32_t *)0x0,pUStack_28);
  }
  return local_2c;
}

Assistant:

int32_t
UnicodeString::toUTF32(UChar32 *utf32, int32_t capacity, UErrorCode &errorCode) const {
  int32_t length32=0;
  if(U_SUCCESS(errorCode)) {
    // getBuffer() and u_strToUTF32WithSub() check for illegal arguments.
    u_strToUTF32WithSub(utf32, capacity, &length32,
        getBuffer(), length(),
        0xfffd,  // Substitution character.
        NULL,    // Don't care about number of substitutions.
        &errorCode);
  }
  return length32;
}